

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBuildVisitor.cpp
# Opt level: O1

void __thiscall CBuildVisitor::Visit(CBuildVisitor *this,CMethod *statement)

{
  CCompoundStm *pCVar1;
  IExpression *pIVar2;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>>>
  *this_00;
  string *psVar3;
  string *methodName;
  ISubtreeWrapper *pIVar4;
  CLabelStatement *this_01;
  CSeqStatement *this_02;
  CMoveStatement *pCVar5;
  CMemExpression *this_03;
  IAddress *pIVar6;
  ISubtreeWrapper *pIVar7;
  CSeqStatement *pCVar8;
  tuple<const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_> this_04;
  ISubtreeWrapper *pIVar9;
  CBuildVisitor *this_05;
  _Alloc_hider _Var10;
  string methodFullName;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_160;
  ISubtreeWrapper *local_158;
  CExpression *local_150;
  __uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_140;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_138;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_130;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_128;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_120;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_118;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_110;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_108;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_100;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_f8;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_f0;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_e8;
  CSeqStatement *local_e0;
  CLabelStatement *local_d8;
  string local_d0;
  string local_b0;
  string local_90;
  CLabel local_70;
  CLabel local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"IRT builder: CMethodStm\n",0x18);
  std::__cxx11::string::_M_assign((string *)&this->currentMethod);
  this_05 = (CBuildVisitor *)statement;
  buildNewFrame(this,statement);
  psVar3 = IRT::CFrame::GetClassName_abi_cxx11_(this->currentFrame);
  methodName = IRT::CFrame::GetMethodName_abi_cxx11_(this->currentFrame);
  GetMethodFullName(&local_d0,this_05,psVar3,methodName);
  pCVar1 = (statement->statements)._M_t.
           super___uniq_ptr_impl<CCompoundStm,_std::default_delete<CCompoundStm>_>._M_t.
           super__Tuple_impl<0UL,_CCompoundStm_*,_std::default_delete<CCompoundStm>_>.
           super__Head_base<0UL,_CCompoundStm_*,_false>._M_head_impl;
  (*(code *)**(undefined8 **)&(pCVar1->super_IStatement).super_PositionedNode)(pCVar1,this);
  pIVar9 = (this->wrapper)._M_t.
           super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>.
           _M_t.
           super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
           .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl;
  (this->wrapper)._M_t.
  super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
  super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
  super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl = (ISubtreeWrapper *)0x0;
  pIVar2 = (statement->returnExp)._M_t.
           super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
           super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
           super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  (*(code *)*(pIVar2->super_PositionedNode).super_INode._vptr_INode)(pIVar2,this);
  (**((this->wrapper)._M_t.
      super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
      super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
      super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl)->_vptr_ISubtreeWrapper)
            (&local_160);
  local_150 = (CExpression *)local_160._M_head_impl;
  if (pIVar9 == (ISubtreeWrapper *)0x0) {
    pIVar7 = (ISubtreeWrapper *)operator_new(0x10);
    pCVar8 = (CSeqStatement *)operator_new(0x18);
    this_04.
    super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
    super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>)
         operator_new(0x28);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,local_d0._M_dataplus._M_p,
               local_d0._M_dataplus._M_p + local_d0._M_string_length);
    IRT::CLabel::CLabel(&local_70,&local_b0);
    IRT::CLabelStatement::CLabelStatement
              ((CLabelStatement *)
               this_04.
               super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
               .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl,&local_70);
    local_140._M_t.
    super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
    super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl =
         (tuple<const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>)
         (tuple<const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>)
         this_04.
         super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
         .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl;
    pCVar5 = (CMoveStatement *)operator_new(0x18);
    pIVar6 = IRT::CFrame::GetReturnValueAddress(this->currentFrame);
    (*pIVar6->_vptr_IAddress[2])(&local_160,pIVar6);
    local_118._M_head_impl = (CExpression *)local_160._M_head_impl;
    local_160._M_head_impl = (CStatement *)0x0;
    local_120._M_head_impl = local_150;
    IRT::CMoveStatement::CMoveStatement
              (pCVar5,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                       *)&local_118,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &local_120);
    local_110._M_head_impl = (CStatement *)pCVar5;
    IRT::CSeqStatement::CSeqStatement
              (pCVar8,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                       *)&local_140,
               (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
               &local_110);
    pIVar7->_vptr_ISubtreeWrapper = (_func_int **)&PTR_ToExpression_001834e0;
    pIVar7[1]._vptr_ISubtreeWrapper = (_func_int **)pCVar8;
    pIVar4 = (this->wrapper)._M_t.
             super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>
             ._M_t.
             super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
             .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl;
    (this->wrapper)._M_t.
    super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
    super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
    super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl = pIVar7;
    if (pIVar4 != (ISubtreeWrapper *)0x0) {
      operator_delete(pIVar4);
    }
    if ((CMoveStatement *)local_110._M_head_impl != (CMoveStatement *)0x0) {
      (*((INode *)&((local_110._M_head_impl)->super_IStatement).super_INode._vptr_INode)->
        _vptr_INode[2])();
    }
    local_110._M_head_impl = (CStatement *)0x0;
    if (local_120._M_head_impl != (CExpression *)0x0) {
      (*(((IStatement *)&(local_120._M_head_impl)->super_IExpression)->super_INode)._vptr_INode[2])
                ();
    }
    local_120._M_head_impl = (CExpression *)0x0;
    if (local_118._M_head_impl != (CExpression *)0x0) {
      (*(((IStatement *)&(local_118._M_head_impl)->super_IExpression)->super_INode)._vptr_INode[2])
                ();
    }
    local_118._M_head_impl = (CExpression *)0x0;
    if (local_160._M_head_impl != (CStatement *)0x0) {
      (*((local_160._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
    }
    if (local_140._M_t.
        super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
        .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl !=
        (_Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>)0x0)
    {
      (**(code **)(*(long *)local_140._M_t.
                            super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
                            .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl +
                  0x10))();
    }
    local_140._M_t.
    super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
    super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl =
         (tuple<const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>)
         (_Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>)0x0
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.label._M_dataplus._M_p != &local_70.label.field_2) {
      operator_delete(local_70.label._M_dataplus._M_p);
    }
    psVar3 = &local_b0;
    _Var10._M_p = local_b0._M_dataplus._M_p;
  }
  else {
    pIVar4 = (ISubtreeWrapper *)operator_new(0x10);
    local_158 = pIVar9;
    local_e0 = (CSeqStatement *)operator_new(0x18);
    this_01 = (CLabelStatement *)operator_new(0x28);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    local_d8 = this_01;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,local_d0._M_dataplus._M_p,
               local_d0._M_dataplus._M_p + local_d0._M_string_length);
    IRT::CLabel::CLabel(&local_50,&local_90);
    IRT::CLabelStatement::CLabelStatement(this_01,&local_50);
    local_128._M_head_impl = (CStatement *)this_01;
    this_02 = (CSeqStatement *)operator_new(0x18);
    (*pIVar9->_vptr_ISubtreeWrapper[1])(&local_160,pIVar9);
    local_130._M_head_impl = local_160._M_head_impl;
    local_160._M_head_impl = (CStatement *)0x0;
    pCVar5 = (CMoveStatement *)operator_new(0x18);
    this_03 = (CMemExpression *)operator_new(0x10);
    pIVar6 = IRT::CFrame::GetReturnValueAddress(this->currentFrame);
    (*pIVar6->_vptr_IAddress[2])(&local_138,pIVar6);
    local_100._M_head_impl = local_138._M_head_impl;
    local_138._M_head_impl = (CExpression *)0x0;
    IRT::CMemExpression::CMemExpression
              (this_03,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                        *)&local_100);
    local_108._M_head_impl = local_150;
    local_f8._M_head_impl = (CExpression *)this_03;
    IRT::CMoveStatement::CMoveStatement
              (pCVar5,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                       *)&local_f8,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &local_108);
    local_f0._M_head_impl = (CStatement *)pCVar5;
    IRT::CSeqStatement::CSeqStatement
              (this_02,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                        *)&local_130,
               (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
               &local_f0);
    pCVar8 = local_e0;
    local_e8._M_head_impl = (CStatement *)this_02;
    IRT::CSeqStatement::CSeqStatement
              (local_e0,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                         *)&local_128,
               (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
               &local_e8);
    pIVar4->_vptr_ISubtreeWrapper = (_func_int **)&PTR_ToExpression_001834e0;
    pIVar4[1]._vptr_ISubtreeWrapper = (_func_int **)pCVar8;
    pIVar9 = (this->wrapper)._M_t.
             super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>
             ._M_t.
             super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
             .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl;
    (this->wrapper)._M_t.
    super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
    super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
    super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl = pIVar4;
    if (pIVar9 != (ISubtreeWrapper *)0x0) {
      operator_delete(pIVar9);
    }
    pIVar9 = local_158;
    if ((CSeqStatement *)local_e8._M_head_impl != (CSeqStatement *)0x0) {
      (*((INode *)&((local_e8._M_head_impl)->super_IStatement).super_INode._vptr_INode)->_vptr_INode
        [2])();
    }
    local_e8._M_head_impl = (CStatement *)0x0;
    if ((CMoveStatement *)local_f0._M_head_impl != (CMoveStatement *)0x0) {
      (*((INode *)&((local_f0._M_head_impl)->super_IStatement).super_INode._vptr_INode)->_vptr_INode
        [2])();
    }
    local_f0._M_head_impl = (CStatement *)0x0;
    if (local_108._M_head_impl != (CExpression *)0x0) {
      (*(((IStatement *)&(local_108._M_head_impl)->super_IExpression)->super_INode)._vptr_INode[2])
                ();
    }
    local_108._M_head_impl = (CExpression *)0x0;
    if ((CMemExpression *)local_f8._M_head_impl != (CMemExpression *)0x0) {
      (*(((CExpression *)&(local_f8._M_head_impl)->super_IExpression)->super_IExpression).
        super_INode._vptr_INode[2])();
    }
    local_f8._M_head_impl = (CExpression *)0x0;
    if (local_100._M_head_impl != (CExpression *)0x0) {
      (*((local_100._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
    local_100._M_head_impl = (CExpression *)0x0;
    if (local_138._M_head_impl != (CExpression *)0x0) {
      (*((local_138._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
    if (local_130._M_head_impl != (CStatement *)0x0) {
      (*((local_130._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
    }
    local_130._M_head_impl = (CStatement *)0x0;
    if (local_160._M_head_impl != (CStatement *)0x0) {
      (*((local_160._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
    }
    if ((CLabelStatement *)local_128._M_head_impl != (CLabelStatement *)0x0) {
      (*((INode *)&((local_128._M_head_impl)->super_IStatement).super_INode._vptr_INode)->
        _vptr_INode[2])();
    }
    local_128._M_head_impl = (CStatement *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.label._M_dataplus._M_p != &local_50.label.field_2) {
      operator_delete(local_50.label._M_dataplus._M_p);
    }
    psVar3 = &local_90;
    _Var10._M_p = local_90._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var10._M_p != &psVar3->field_2) {
    operator_delete(_Var10._M_p);
  }
  this_00 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>>>
             *)(this->treesOfMethods).
               super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
  (*((this->wrapper)._M_t.
     super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
     super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
     super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl)->_vptr_ISubtreeWrapper[1])
            (&local_160);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>>>
  ::
  _M_emplace_unique<std::__cxx11::string&,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>
            (this_00,&local_d0,
             (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
             &local_160);
  if (local_160._M_head_impl != (CStatement *)0x0) {
    (*((local_160._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
  }
  if (pIVar9 != (ISubtreeWrapper *)0x0) {
    operator_delete(pIVar9);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CBuildVisitor::Visit( CMethod &statement ) {

    std::cout << "IRT builder: CMethodStm\n";
    currentMethod = statement.name->name;
    buildNewFrame( &statement );
    std::string methodFullName = GetMethodFullName( currentFrame->GetClassName( ), currentFrame->GetMethodName( ));

    statement.statements->Accept( *this );
    std::unique_ptr<IRT::ISubtreeWrapper> statementListWrapper = std::move( wrapper );

    statement.returnExp->Accept( *this );
    std::unique_ptr<const IRT::CExpression> expressionReturn = std::move( wrapper->ToExpression( ));

    if ( statementListWrapper ) {
        updateSubtreeWrapper( new IRT::CStatementWrapper(
                std::move( std::unique_ptr<const IRT::CStatement>( new IRT::CSeqStatement(
                        std::move( std::unique_ptr<const IRT::CStatement>(
                                new IRT::CLabelStatement( IRT::CLabel( methodFullName )))),
                        std::move( std::unique_ptr<const IRT::CStatement>( new IRT::CSeqStatement(
                                std::move( statementListWrapper->ToStatement( )),
                                std::move( std::unique_ptr<const IRT::CStatement>(
                                        new IRT::CMoveStatement(
                                                std::move( std::unique_ptr<IRT::CExpression>( new IRT::CMemExpression(
                                                        std::move(
                                                                currentFrame->GetReturnValueAddress( )->ToExpression( ))))),
                                                std::move( expressionReturn )
                                        )
                                ))
                        )))
                )))
        ));
    } else {
        updateSubtreeWrapper( new IRT::CStatementWrapper(
                std::move( std::unique_ptr<const IRT::CStatement>( new IRT::CSeqStatement(
                        std::move( std::unique_ptr<const IRT::CStatement>(
                                new IRT::CLabelStatement( IRT::CLabel( methodFullName )))),
                        std::move( std::unique_ptr<const IRT::CStatement>( new IRT::CMoveStatement(
                                std::move( currentFrame->GetReturnValueAddress( )->ToExpression( )),
                                std::move( expressionReturn )
                        )))
                )))
        ));
    }

    treesOfMethods->emplace( methodFullName, std::move( wrapper->ToStatement( )));
}